

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O1

bool __thiscall Token::operator==(Token *this,Token *rhs)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  
  if (this->mType == rhs->mType) {
    bVar1 = NumericConstant::operator!=(&this->mNumericValue,&rhs->mNumericValue);
    if ((((bVar1) || (this->mCharValue != rhs->mCharValue)) ||
        (this->mCharValue2 != rhs->mCharValue2)) ||
       (__n = (this->mIdentifier)._M_string_length, __n != (rhs->mIdentifier)._M_string_length)) {
      bVar1 = false;
    }
    else if (__n == 0) {
      bVar1 = true;
    }
    else {
      iVar2 = bcmp((this->mIdentifier)._M_dataplus._M_p,(rhs->mIdentifier)._M_dataplus._M_p,__n);
      bVar1 = iVar2 == 0;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool Token::operator==(const Token& rhs) const {
	if (mType != rhs.mType) {
		return false;
	}

	if (mNumericValue != rhs.numericValue()) {
		return false;
	}

	if (mCharValue != rhs.mCharValue) {
		return false;
	}

	if (mCharValue2 != rhs.mCharValue2) {
		return false;
	}

	if (mIdentifier != rhs.mIdentifier) {
		return false;
	}

	return true;
}